

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void RangeEnc_EncodeBit_1(CPpmd7z_RangeEnc *p,UInt32 size0)

{
  uint uVar1;
  int in_ESI;
  long *in_RDI;
  UInt32 newBound;
  
  uVar1 = (*(uint *)(in_RDI + 1) >> 0xe) * in_ESI;
  *in_RDI = (ulong)uVar1 + *in_RDI;
  *(uint *)(in_RDI + 1) = (int)in_RDI[1] - uVar1;
  while (*(uint *)(in_RDI + 1) < 0x1000000) {
    *(int *)(in_RDI + 1) = (int)in_RDI[1] << 8;
    RangeEnc_ShiftLow((CPpmd7z_RangeEnc *)CONCAT44(in_ESI,uVar1));
  }
  return;
}

Assistant:

static void RangeEnc_EncodeBit_1(CPpmd7z_RangeEnc *p, UInt32 size0)
{
  UInt32 newBound = (p->Range >> 14) * size0;
  p->Low += newBound;
  p->Range -= newBound;
  while (p->Range < kTopValue)
  {
    p->Range <<= 8;
    RangeEnc_ShiftLow(p);
  }
}